

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::scrape_failed_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,scrape_failed_alert *this)

{
  char *__rhs;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  scrape_failed_alert *local_18;
  scrape_failed_alert *this_local;
  
  local_18 = this;
  this_local = (scrape_failed_alert *)__return_storage_ptr__;
  tracker_alert::message_abi_cxx11_(&local_58,&this->super_tracker_alert);
  std::operator+(&local_38,&local_58," scrape failed: ");
  __rhs = error_message(this);
  std::operator+(__return_storage_ptr__,&local_38,__rhs);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string scrape_failed_alert::message() const
	{
		return tracker_alert::message() + " scrape failed: " + error_message();
	}